

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGMPBigInt.cpp
# Opt level: O0

CGMPBigInt * __thiscall CGMPBigInt::MulRate(CGMPBigInt *this,float fRatio)

{
  undefined1 local_28 [8];
  mpz_t temp;
  float fRatio_local;
  CGMPBigInt *this_local;
  
  temp[0]._mp_d._4_4_ = fRatio;
  mpz_init((__mpz_struct *)local_28);
  mpz_mul_si((__mpz_struct *)local_28,this->m_value,(long)(temp[0]._mp_d._4_4_ * 1000.0));
  mpz_fdiv_q_ui(this->m_value,(__mpz_struct *)local_28,1000);
  mpz_clear((__mpz_struct *)local_28);
  return this;
}

Assistant:

CGMPBigInt &CGMPBigInt::MulRate(float fRatio)
{
    mpz_t temp;
    mpz_init(temp);
    mpz_mul_si(temp, m_value, (long)(fRatio*1000));
    mpz_fdiv_q_ui(m_value, temp, 1000);
    mpz_clear(temp);
    return *this;
}